

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::DisposeOutPts(OutPt **pp)

{
  OutPt *pOVar1;
  
  if (*pp != (OutPt *)0x0) {
    (*pp)->prev->next = (OutPt *)0x0;
    while (pOVar1 = *pp, pOVar1 != (OutPt *)0x0) {
      *pp = pOVar1->next;
      operator_delete(pOVar1,0x28);
    }
  }
  return;
}

Assistant:

void DisposeOutPts(OutPt*& pp)
{
  if (pp == 0) return;
  pp->prev->next = 0;
  while( pp )
  {
    OutPt *tmpPp = pp;
    pp = pp->next;
    delete tmpPp ;
  }
}